

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O3

void mixed_free_pack(mixed_pack *pack)

{
  if (pack->_data != (uchar *)0x0) {
    (*mixed_free)(pack->_data);
  }
  pack->_data = (uchar *)0x0;
  pack->size = 0;
  LOCK();
  pack->read = 0;
  UNLOCK();
  LOCK();
  pack->write = 0;
  UNLOCK();
  LOCK();
  pack->reserved = 0;
  UNLOCK();
  return;
}

Assistant:

MIXED_EXPORT void mixed_free_pack(struct mixed_pack *pack){
  if(pack->_data)
    mixed_free(pack->_data);
  pack->_data = 0;
  pack->size = 0;
  mixed_pack_clear(pack);
}